

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&>::streamReconstructedExpression
          (BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  uint in_EDX;
  uint value;
  string *in_R9;
  StringRef op;
  string local_60;
  string local_40;
  
  StringMaker<unsigned_int,void>::convert_abi_cxx11_
            (&local_40,(StringMaker<unsigned_int,void> *)(ulong)*this->m_lhs,in_EDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<unsigned_int,void>::convert_abi_cxx11_
            (&local_60,(StringMaker<unsigned_int,void> *)(ulong)*this->m_rhs,value);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }